

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_opt.c
# Opt level: O0

MPP_RET mpp_opt_setup(MppOpt opt,void *ctx)

{
  MppOptImpl *impl;
  void *ctx_local;
  MppOpt opt_local;
  
  if (opt == (MppOpt)0x0) {
    opt_local._4_4_ = MPP_NOK;
  }
  else {
    mpp_trie_init((long)opt + 8,"mpp_opt");
    if (*(long *)((long)opt + 8) == 0) {
      opt_local._4_4_ = MPP_NOK;
    }
    else {
      *(void **)opt = ctx;
      opt_local._4_4_ = MPP_OK;
    }
  }
  return opt_local._4_4_;
}

Assistant:

MPP_RET mpp_opt_setup(MppOpt opt, void *ctx)
{
    MppOptImpl *impl = (MppOptImpl *)opt;

    if (NULL == impl)
        return MPP_NOK;

    mpp_trie_init(&impl->trie, "mpp_opt");
    if (impl->trie) {
        impl->ctx = ctx;
        return MPP_OK;
    }

    return MPP_NOK;
}